

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_info.cpp
# Opt level: O1

void __thiscall
ObjectInfoCollection::RemoveObject
          (ObjectInfoCollection *this,uint64_t object_handle,XrObjectType object_type)

{
  iterator __last;
  XrSdkLogObjectInfo *pXVar1;
  long lVar2;
  iterator __first;
  XrSdkLogObjectInfo *pXVar3;
  
  pXVar3 = (this->object_info_).
           super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  __last._M_current =
       (this->object_info_).
       super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
       super__Vector_impl_data._M_finish;
  lVar2 = ((long)__last._M_current - (long)pXVar3 >> 4) * -0x5555555555555555 >> 2;
  pXVar1 = pXVar3;
  if (0 < lVar2) {
    pXVar1 = pXVar3 + lVar2 * 4;
    lVar2 = lVar2 + 1;
    __first._M_current = pXVar3 + 2;
    do {
      if ((__first._M_current[-2].handle == object_handle) &&
         (__first._M_current[-2].type == object_type)) {
        __first._M_current = __first._M_current + -2;
        goto LAB_0010878d;
      }
      if ((__first._M_current[-1].handle == object_handle) &&
         (__first._M_current[-1].type == object_type)) {
        __first._M_current = __first._M_current + -1;
        goto LAB_0010878d;
      }
      if (((__first._M_current)->handle == object_handle) &&
         ((__first._M_current)->type == object_type)) goto LAB_0010878d;
      if ((__first._M_current[1].handle == object_handle) &&
         (__first._M_current[1].type == object_type)) {
        __first._M_current = __first._M_current + 1;
        goto LAB_0010878d;
      }
      lVar2 = lVar2 + -1;
      __first._M_current = __first._M_current + 4;
    } while (1 < lVar2);
  }
  lVar2 = ((long)__last._M_current - (long)pXVar1 >> 4) * -0x5555555555555555;
  if (lVar2 != 1) {
    if (lVar2 != 2) {
      __first._M_current = __last._M_current;
      if ((lVar2 != 3) ||
         ((pXVar1->handle == object_handle &&
          (__first._M_current = pXVar1, pXVar1->type == object_type)))) goto LAB_0010878d;
      pXVar1 = pXVar1 + 1;
    }
    if ((pXVar1->handle == object_handle) &&
       (__first._M_current = pXVar1, pXVar1->type == object_type)) goto LAB_0010878d;
    pXVar1 = pXVar1 + 1;
  }
  __first._M_current = __last._M_current;
  if (pXVar1->type == object_type) {
    __first._M_current = pXVar1;
  }
  if (pXVar1->handle != object_handle) {
    __first._M_current = __last._M_current;
  }
LAB_0010878d:
  pXVar3 = __first._M_current + 1;
  if (pXVar3 != __last._M_current && __first._M_current != __last._M_current) {
    do {
      if ((pXVar3->handle != object_handle) || (pXVar3->type != object_type)) {
        (__first._M_current)->type = pXVar3->type;
        (__first._M_current)->handle = pXVar3->handle;
        std::__cxx11::string::operator=
                  ((string *)&(__first._M_current)->name,(string *)&pXVar3->name);
        __first._M_current = __first._M_current + 1;
      }
      pXVar3 = pXVar3 + 1;
    } while (pXVar3 != __last._M_current);
  }
  std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::_M_erase
            (&this->object_info_,__first,__last);
  return;
}

Assistant:

void ObjectInfoCollection::RemoveObject(uint64_t object_handle, XrObjectType object_type) {
    vector_remove_if_and_erase(
        object_info_, [=](XrSdkLogObjectInfo const& info) { return info.handle == object_handle && info.type == object_type; });
}